

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool check_dic_utf_8(char *path)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  char *mes;
  char *in_RDI;
  char *p;
  char *res;
  char str [6];
  FILE *fp;
  char file [260];
  size_t in_stack_fffffffffffffec8;
  char *str_00;
  char *in_stack_fffffffffffffed0;
  char cVar3;
  char *in_stack_fffffffffffffed8;
  char local_118 [280];
  
  if ((in_RDI != (char *)0x0) && (sVar2 = strlen(in_RDI), sVar2 != 0)) {
    clear_path_string(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    u8tou8_path(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    sVar2 = strlen(local_118);
    if (sVar2 + 9 < 0x105) {
      strcat(local_118,G_SLASH_CHAR);
      strcat(local_118,"unk.dic");
      __stream = fopen(local_118,"rb");
      if (__stream != (FILE *)0x0) {
        iVar1 = fseek(__stream,0x28,0);
        if (iVar1 == 0) {
          mes = fgets(&stack0xfffffffffffffeda,6,__stream);
          if (mes == (char *)0x0) {
            fclose(__stream);
          }
          else {
            fclose(__stream);
            str_00 = &stack0xfffffffffffffeda;
            cVar3 = (char)((ulong)in_stack_fffffffffffffed8 >> 0x10);
            if ((cVar3 == 'U') || (cVar3 == 'u')) {
              str_00 = &stack0xfffffffffffffedb;
              cVar3 = (char)((ulong)in_stack_fffffffffffffed8 >> 0x18);
              if ((cVar3 == 'T') || (cVar3 == 't')) {
                str_00 = &stack0xfffffffffffffedc;
                cVar3 = (char)((ulong)in_stack_fffffffffffffed8 >> 0x20);
                if ((cVar3 == 'F') || (cVar3 == 'f')) {
                  str_00 = &stack0xfffffffffffffedd;
                  cVar3 = (char)((ulong)in_stack_fffffffffffffed8 >> 0x28);
                  if (((cVar3 == '-') || (cVar3 == '_')) &&
                     (str_00 = &stack0xfffffffffffffede,
                     (char)((ulong)in_stack_fffffffffffffed8 >> 0x30) == '8')) {
                    return true;
                  }
                }
              }
            }
            if ((g_verbose & 1U) != 0) {
              console_message_string(mes,str_00);
            }
          }
        }
        else {
          fclose(__stream);
        }
      }
    }
  }
  return false;
}

Assistant:

bool check_dic_utf_8(const char *path)
{
	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}
	char file[MAX_PATH];
	clear_path_string(file, MAX_PATH);
#if defined(_WIN32)
	u8tosjis_path(path, file);
#else
	u8tou8_path(path, file);
#endif
	if (7 + 1 + strlen(file) + 1 > MAX_PATH)
	{
		return false;
	}

	strcat(file, G_SLASH_CHAR);
	strcat(file, "unk.dic");

	FILE *fp = fopen(file, "rb");
	if (!fp)
	{
		return false;
	}
	if (fseek(fp, 0x28, SEEK_SET) != 0)
	{
		fclose(fp);
		return false;
	}
	char str[6];
	char *res = fgets(str, 6, fp);
	if( res == NULL )
	{
		fclose(fp);
		return false;
	}
	fclose(fp);
	char *p = str;
	if (*p != 'U' && *p != 'u')
		goto exit_false;
	p++;
	if (*p != 'T' && *p != 't')
		goto exit_false;
	p++;
	if (*p != 'F' && *p != 'f')
		goto exit_false;
	p++;
	if (*p != '-' && *p != '_')
		goto exit_false;
	p++;
	if (*p != '8')
		goto exit_false;
	return true;

exit_false:
	if (g_verbose)
	{
		console_message_string(u8"this dic is not in utf-8: %s\n", (char*)path);
	}
	return false;
}